

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O3

bool __thiscall
Debugger::HandleDebugEvent(Debugger *this,JsDiagDebugEvent debugEvent,JsValueRef eventData)

{
  bool bVar1;
  JsErrorCode jsErrorCode;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  JsValueRef local_30;
  JsValueRef result;
  JsValueRef debugEventRef;
  
  jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDoubleToNumber)((double)debugEvent,&result);
  if (jsErrorCode == JsNoError) {
    local_30 = (JsValueRef)0x0;
    bVar1 = CallFunction(this,"HandleDebugEvent",&local_30,result,eventData);
  }
  else {
    bVar1 = false;
    pPVar2 = PAL_get_stderr(0);
    pWVar3 = Helpers::JsErrorCodeToString(jsErrorCode);
    PAL_fwprintf(pPVar2,
                 L"ERROR: ChakraRTInterface::JsDoubleToNumber(debugEvent, &debugEventRef) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)jsErrorCode,pWVar3);
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
  }
  return bVar1;
}

Assistant:

bool Debugger::HandleDebugEvent(JsDiagDebugEvent debugEvent, JsValueRef eventData)
{
    JsValueRef debugEventRef;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsDoubleToNumber(debugEvent, &debugEventRef));

    return this->CallFunctionNoResult("HandleDebugEvent", debugEventRef, eventData);
}